

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O0

void hashlittle2(void *key,size_t length,uint32_t *pc,uint32_t *pb)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint8_t *k_2;
  uint8_t *k8;
  uint16_t *k_1;
  uint32_t *k;
  anon_union_8_2_f9ecd746 u;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t *pb_local;
  uint32_t *pc_local;
  size_t length_local;
  void *key_local;
  
  b = (int)length + -0x21524111 + *pc;
  c = *pb + b;
  k = (uint32_t *)key;
  a = b;
  length_local = length;
  if (((ulong)key & 3) == 0) {
    for (; 0xc < length_local; length_local = length_local - 0xc) {
      uVar1 = k[2] + c;
      uVar2 = uVar1 * 0x10 ^ uVar1 >> 0x1c ^ (*k + a) - uVar1;
      iVar3 = k[1] + b + uVar1;
      uVar1 = uVar2 << 6 ^ uVar2 >> 0x1a ^ (k[1] + b) - uVar2;
      iVar4 = iVar3 + uVar2;
      uVar2 = uVar1 << 8 ^ uVar1 >> 0x18 ^ iVar3 - uVar1;
      iVar3 = iVar4 + uVar1;
      uVar1 = uVar2 << 0x10 ^ uVar2 >> 0x10 ^ iVar4 - uVar2;
      iVar4 = iVar3 + uVar2;
      uVar2 = uVar1 << 0x13 ^ uVar1 >> 0xd ^ iVar3 - uVar1;
      a = iVar4 + uVar1;
      c = uVar2 << 4 ^ uVar2 >> 0x1c ^ iVar4 - uVar2;
      b = a + uVar2;
      k = k + 3;
    }
    switch(length_local) {
    case 0:
      *pc = c;
      *pb = b;
      return;
    case 1:
      a = (*k & 0xff) + a;
      break;
    case 2:
      a = (*k & 0xffff) + a;
      break;
    case 3:
      a = (*k & 0xffffff) + a;
      break;
    case 4:
      a = *k + a;
      break;
    case 5:
      b = (k[1] & 0xff) + b;
      a = *k + a;
      break;
    case 6:
      b = (k[1] & 0xffff) + b;
      a = *k + a;
      break;
    case 7:
      b = (k[1] & 0xffffff) + b;
      a = *k + a;
      break;
    case 8:
      b = k[1] + b;
      a = *k + a;
      break;
    case 9:
      c = (k[2] & 0xff) + c;
      b = k[1] + b;
      a = *k + a;
      break;
    case 10:
      c = (k[2] & 0xffff) + c;
      b = k[1] + b;
      a = *k + a;
      break;
    case 0xb:
      c = (k[2] & 0xffffff) + c;
      b = k[1] + b;
      a = *k + a;
      break;
    case 0xc:
      c = k[2] + c;
      b = k[1] + b;
      a = *k + a;
    }
  }
  else {
    k_2 = (uint8_t *)key;
    k_1 = (uint16_t *)key;
    if (((ulong)key & 1) == 0) {
      for (; 0xc < length_local; length_local = length_local - 0xc) {
        iVar3 = (uint)k_1[2] + (uint)k_1[3] * 0x10000 + b;
        uVar1 = (uint)k_1[4] + (uint)k_1[5] * 0x10000 + c;
        uVar2 = uVar1 * 0x10 ^ uVar1 >> 0x1c ^ ((uint)*k_1 + (uint)k_1[1] * 0x10000 + a) - uVar1;
        iVar4 = iVar3 + uVar1;
        uVar1 = uVar2 << 6 ^ uVar2 >> 0x1a ^ iVar3 - uVar2;
        iVar3 = iVar4 + uVar2;
        uVar2 = uVar1 << 8 ^ uVar1 >> 0x18 ^ iVar4 - uVar1;
        iVar4 = iVar3 + uVar1;
        uVar1 = uVar2 << 0x10 ^ uVar2 >> 0x10 ^ iVar3 - uVar2;
        iVar3 = iVar4 + uVar2;
        uVar2 = uVar1 << 0x13 ^ uVar1 >> 0xd ^ iVar4 - uVar1;
        a = iVar3 + uVar1;
        c = uVar2 << 4 ^ uVar2 >> 0x1c ^ iVar3 - uVar2;
        b = a + uVar2;
        k_1 = k_1 + 6;
      }
      switch(length_local) {
      case 0:
        *pc = c;
        *pb = b;
        return;
      case 1:
        a = (byte)*k_1 + a;
        break;
      case 3:
        a = (uint)(byte)k_1[1] * 0x10000 + a;
      case 2:
        a = *k_1 + a;
        break;
      case 5:
        b = (byte)k_1[2] + b;
      case 4:
        a = (uint)*k_1 + (uint)k_1[1] * 0x10000 + a;
        break;
      case 7:
        b = (uint)(byte)k_1[3] * 0x10000 + b;
      case 6:
        b = k_1[2] + b;
        a = (uint)*k_1 + (uint)k_1[1] * 0x10000 + a;
        break;
      case 9:
        c = (byte)k_1[4] + c;
      case 8:
        b = (uint)k_1[2] + (uint)k_1[3] * 0x10000 + b;
        a = (uint)*k_1 + (uint)k_1[1] * 0x10000 + a;
        break;
      case 0xb:
        c = (uint)(byte)k_1[5] * 0x10000 + c;
      case 10:
        c = k_1[4] + c;
        b = (uint)k_1[2] + (uint)k_1[3] * 0x10000 + b;
        a = (uint)*k_1 + (uint)k_1[1] * 0x10000 + a;
        break;
      case 0xc:
        c = (uint)k_1[4] + (uint)k_1[5] * 0x10000 + c;
        b = (uint)k_1[2] + (uint)k_1[3] * 0x10000 + b;
        a = (uint)*k_1 + (uint)k_1[1] * 0x10000 + a;
      }
    }
    else {
      for (; 0xc < length_local; length_local = length_local - 0xc) {
        iVar3 = (uint)k_2[7] * 0x1000000 +
                (uint)k_2[6] * 0x10000 + (uint)k_2[5] * 0x100 + k_2[4] + b;
        uVar1 = (uint)k_2[0xb] * 0x1000000 +
                (uint)k_2[10] * 0x10000 + (uint)k_2[9] * 0x100 + k_2[8] + c;
        uVar2 = uVar1 * 0x10 ^ uVar1 >> 0x1c ^
                ((uint)k_2[3] * 0x1000000 + (uint)k_2[2] * 0x10000 + (uint)k_2[1] * 0x100 + *k_2 + a
                ) - uVar1;
        iVar4 = iVar3 + uVar1;
        uVar1 = uVar2 << 6 ^ uVar2 >> 0x1a ^ iVar3 - uVar2;
        iVar3 = iVar4 + uVar2;
        uVar2 = uVar1 << 8 ^ uVar1 >> 0x18 ^ iVar4 - uVar1;
        iVar4 = iVar3 + uVar1;
        uVar1 = uVar2 << 0x10 ^ uVar2 >> 0x10 ^ iVar3 - uVar2;
        iVar3 = iVar4 + uVar2;
        uVar2 = uVar1 << 0x13 ^ uVar1 >> 0xd ^ iVar4 - uVar1;
        a = iVar3 + uVar1;
        c = uVar2 << 4 ^ uVar2 >> 0x1c ^ iVar3 - uVar2;
        b = a + uVar2;
        k_2 = k_2 + 0xc;
      }
      switch(length_local) {
      case 0:
        *pc = c;
        *pb = b;
        return;
      case 0xc:
        c = (uint)k_2[0xb] * 0x1000000 + c;
      case 0xb:
        c = (uint)k_2[10] * 0x10000 + c;
      case 10:
        c = (uint)k_2[9] * 0x100 + c;
      case 9:
        c = k_2[8] + c;
      case 8:
        b = (uint)k_2[7] * 0x1000000 + b;
      case 7:
        b = (uint)k_2[6] * 0x10000 + b;
      case 6:
        b = (uint)k_2[5] * 0x100 + b;
      case 5:
        b = k_2[4] + b;
      case 4:
        a = (uint)k_2[3] * 0x1000000 + a;
      case 3:
        a = (uint)k_2[2] * 0x10000 + a;
      case 2:
        a = (uint)k_2[1] * 0x100 + a;
      case 1:
        a = *k_2 + a;
      }
    }
  }
  uVar1 = (b ^ c) - (b << 0xe ^ b >> 0x12);
  uVar2 = (uVar1 ^ a) - (uVar1 * 0x800 ^ uVar1 >> 0x15);
  uVar5 = (uVar2 ^ b) - (uVar2 * 0x2000000 ^ uVar2 >> 7);
  uVar1 = (uVar5 ^ uVar1) - (uVar5 * 0x10000 ^ uVar5 >> 0x10);
  uVar2 = (uVar1 ^ uVar2) - (uVar1 * 0x10 ^ uVar1 >> 0x1c);
  uVar2 = (uVar2 ^ uVar5) - (uVar2 * 0x4000 ^ uVar2 >> 0x12);
  *pc = (uVar2 ^ uVar1) - (uVar2 * 0x1000000 ^ uVar2 >> 8);
  *pb = uVar2;
  return;
}

Assistant:

void hashlittle2( 
  const void *key,       /* the key to hash */
  size_t      length,    /* length of the key */
  uint32_t   *pc,        /* IN: primary initval, OUT: primary hash */
  uint32_t   *pb)        /* IN: secondary initval, OUT: secondary hash */
{
  uint32_t a,b,c;                                          /* internal state */
  union { const void *ptr; size_t i; } u;     /* needed for Mac Powerbook G4 */

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + ((uint32_t)length) + *pc;
  c += *pb;

  u.ptr = key;
  if (HASH_LITTLE_ENDIAN && ((u.i & 0x3) == 0)) {
    const uint32_t *k = (const uint32_t *)key;         /* read 32-bit chunks */
#ifdef VALGRIND
    const uint8_t  *k8;
#endif

    /*------ all but last block: aligned reads and affect 32 bits of (a,b,c) */
    while (length > 12)
    {
      a += k[0];
      b += k[1];
      c += k[2];
      mix(a,b,c);
      length -= 12;
      k += 3;
    }

    /*----------------------------- handle the last (probably partial) block */
    /* 
     * "k[2]&0xffffff" actually reads beyond the end of the string, but
     * then masks off the part it's not allowed to read.  Because the
     * string is aligned, the masked-off tail is in the same word as the
     * rest of the string.  Every machine with memory protection I've seen
     * does it on word boundaries, so is OK with this.  But VALGRIND will
     * still catch it and complain.  The masking trick does make the hash
     * noticably faster for short strings (like English words).
     */
#ifndef VALGRIND

    switch(length)
    {
    case 12: c+=k[2]; b+=k[1]; a+=k[0]; break;
    case 11: c+=k[2]&0xffffff; b+=k[1]; a+=k[0]; break;
    case 10: c+=k[2]&0xffff; b+=k[1]; a+=k[0]; break;
    case 9 : c+=k[2]&0xff; b+=k[1]; a+=k[0]; break;
    case 8 : b+=k[1]; a+=k[0]; break;
    case 7 : b+=k[1]&0xffffff; a+=k[0]; break;
    case 6 : b+=k[1]&0xffff; a+=k[0]; break;
    case 5 : b+=k[1]&0xff; a+=k[0]; break;
    case 4 : a+=k[0]; break;
    case 3 : a+=k[0]&0xffffff; break;
    case 2 : a+=k[0]&0xffff; break;
    case 1 : a+=k[0]&0xff; break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }

#else /* make valgrind happy */

    k8 = (const uint8_t *)k;
    switch(length)
    {
    case 12: c+=k[2]; b+=k[1]; a+=k[0]; break;
    case 11: c+=((uint32_t)k8[10])<<16;  /* fall through */
    case 10: c+=((uint32_t)k8[9])<<8;    /* fall through */
    case 9 : c+=k8[8];                   /* fall through */
    case 8 : b+=k[1]; a+=k[0]; break;
    case 7 : b+=((uint32_t)k8[6])<<16;   /* fall through */
    case 6 : b+=((uint32_t)k8[5])<<8;    /* fall through */
    case 5 : b+=k8[4];                   /* fall through */
    case 4 : a+=k[0]; break;
    case 3 : a+=((uint32_t)k8[2])<<16;   /* fall through */
    case 2 : a+=((uint32_t)k8[1])<<8;    /* fall through */
    case 1 : a+=k8[0]; break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }

#endif /* !valgrind */

  } else if (HASH_LITTLE_ENDIAN && ((u.i & 0x1) == 0)) {
    const uint16_t *k = (const uint16_t *)key;         /* read 16-bit chunks */
    const uint8_t  *k8;

    /*--------------- all but last block: aligned reads and different mixing */
    while (length > 12)
    {
      a += k[0] + (((uint32_t)k[1])<<16);
      b += k[2] + (((uint32_t)k[3])<<16);
      c += k[4] + (((uint32_t)k[5])<<16);
      mix(a,b,c);
      length -= 12;
      k += 6;
    }

    /*----------------------------- handle the last (probably partial) block */
    k8 = (const uint8_t *)k;
    switch(length)
    {
    case 12: c+=k[4]+(((uint32_t)k[5])<<16);
             b+=k[2]+(((uint32_t)k[3])<<16);
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 11: c+=((uint32_t)k8[10])<<16;     /* fall through */
    case 10: c+=k[4];
             b+=k[2]+(((uint32_t)k[3])<<16);
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 9 : c+=k8[8];                      /* fall through */
    case 8 : b+=k[2]+(((uint32_t)k[3])<<16);
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 7 : b+=((uint32_t)k8[6])<<16;      /* fall through */
    case 6 : b+=k[2];
             a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 5 : b+=k8[4];                      /* fall through */
    case 4 : a+=k[0]+(((uint32_t)k[1])<<16);
             break;
    case 3 : a+=((uint32_t)k8[2])<<16;      /* fall through */
    case 2 : a+=k[0];
             break;
    case 1 : a+=k8[0];
             break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }

  } else {                        /* need to read the key one byte at a time */
    const uint8_t *k = (const uint8_t *)key;

    /*--------------- all but the last block: affect some 32 bits of (a,b,c) */
    while (length > 12)
    {
      a += k[0];
      a += ((uint32_t)k[1])<<8;
      a += ((uint32_t)k[2])<<16;
      a += ((uint32_t)k[3])<<24;
      b += k[4];
      b += ((uint32_t)k[5])<<8;
      b += ((uint32_t)k[6])<<16;
      b += ((uint32_t)k[7])<<24;
      c += k[8];
      c += ((uint32_t)k[9])<<8;
      c += ((uint32_t)k[10])<<16;
      c += ((uint32_t)k[11])<<24;
      mix(a,b,c);
      length -= 12;
      k += 12;
    }

    /*-------------------------------- last block: affect all 32 bits of (c) */
    switch(length)                   /* all the case statements fall through */
    {
    case 12: c+=((uint32_t)k[11])<<24;
    case 11: c+=((uint32_t)k[10])<<16;
    case 10: c+=((uint32_t)k[9])<<8;
    case 9 : c+=k[8];
    case 8 : b+=((uint32_t)k[7])<<24;
    case 7 : b+=((uint32_t)k[6])<<16;
    case 6 : b+=((uint32_t)k[5])<<8;
    case 5 : b+=k[4];
    case 4 : a+=((uint32_t)k[3])<<24;
    case 3 : a+=((uint32_t)k[2])<<16;
    case 2 : a+=((uint32_t)k[1])<<8;
    case 1 : a+=k[0];
             break;
    case 0 : *pc=c; *pb=b; return;  /* zero length strings require no mixing */
    }
  }

  final(a,b,c);
  *pc=c; *pb=b; return;             /* zero length strings require no mixing */
}